

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O2

bool crnlib::etc1_block::unpack_color5
               (color_quad_u8 *result,uint16 packed_color5,uint16 packed_delta3,bool scaled,
               uint alpha)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  color_quad_i16 dc;
  
  unpack_delta3((etc1_block *)&dc,packed_delta3);
  uVar2 = (int)dc.field_0.field_0.b + (packed_color5 & 0x1f);
  uVar3 = (int)dc.field_0.field_0.g + (packed_color5 >> 5 & 0x1f);
  uVar4 = (int)dc.field_0.field_0.r + (packed_color5 >> 10 & 0x1f);
  uVar1 = uVar3 | uVar2 | uVar4;
  if (0x1f < uVar1) {
    if (0x1e < (int)uVar4) {
      uVar4 = 0x1f;
    }
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    if (0x1e < (int)uVar3) {
      uVar3 = 0x1f;
    }
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar5 = 0x1f;
    if ((int)uVar2 < 0x1f) {
      uVar5 = uVar2;
    }
    uVar2 = uVar5;
    if ((int)uVar5 < 1) {
      uVar2 = 0;
    }
  }
  if (scaled) {
    uVar2 = uVar2 >> 2 | uVar2 * 8;
    uVar3 = (int)uVar3 >> 2 | uVar3 * 8;
    uVar4 = uVar4 >> 2 | uVar4 * 8;
  }
  uVar6 = 0xff;
  if (alpha < 0xff) {
    uVar6 = alpha;
  }
  (result->field_0).field_0.r = (uchar)uVar4;
  (result->field_0).field_0.g = (uchar)uVar3;
  (result->field_0).field_0.b = (uchar)uVar2;
  (result->field_0).field_0.a = (uchar)uVar6;
  return uVar1 < 0x20;
}

Assistant:

bool etc1_block::unpack_color5(color_quad_u8& result, uint16 packed_color5, uint16 packed_delta3, bool scaled, uint alpha) {
  color_quad_i16 dc(unpack_delta3(packed_delta3));

  int b = (packed_color5 & 31U) + dc.b;
  int g = ((packed_color5 >> 5U) & 31U) + dc.g;
  int r = ((packed_color5 >> 10U) & 31U) + dc.r;

  bool success = true;
  if (static_cast<uint>(r | g | b) > 31U) {
    success = false;
    r = math::clamp<int>(r, 0, 31);
    g = math::clamp<int>(g, 0, 31);
    b = math::clamp<int>(b, 0, 31);
  }

  if (scaled) {
    b = (b << 3U) | (b >> 2U);
    g = (g << 3U) | (g >> 2U);
    r = (r << 3U) | (r >> 2U);
  }

  result.set_noclamp_rgba(r, g, b, math::minimum(alpha, 255U));
  return success;
}